

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

int lj_cconv_tv_bf(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  lua_Number lVar7;
  
  uVar1 = s->info;
  uVar3 = uVar1 >> 0x10 & 0x7f;
  if (uVar3 == 1) {
    uVar6 = (uint)*sp;
  }
  else if (uVar3 == 2) {
    uVar6 = (uint)*(ushort *)sp;
  }
  else {
    uVar6 = 0;
    if (uVar3 == 4) {
      uVar6 = *(uint *)sp;
    }
  }
  uVar5 = uVar1 >> 8 & 0x7f;
  if (uVar5 + (uVar1 & 0x7f) <= uVar3 << 3) {
    if ((uVar1 >> 0x1b & 1) == 0) {
      bVar2 = 0x20 - (char)uVar5;
      uVar6 = uVar6 << (bVar2 - (char)(uVar1 & 0x7f) & 0x1f);
      if ((uVar1 >> 0x17 & 1) == 0) {
        lVar7 = (lua_Number)((int)uVar6 >> (bVar2 & 0x1f));
      }
      else {
        lVar7 = (lua_Number)(uVar6 >> (bVar2 & 0x1f));
      }
      o->n = lVar7;
    }
    else {
      uVar4 = ~((ulong)(((uVar6 >> (uVar1 & 0x1f) & 1) != 0) + 1) << 0x2f);
      o->u64 = uVar4;
      (cts->g->tmptv2).u64 = uVar4;
    }
    return 0;
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_NYIPACKBIT);
}

Assistant:

int lj_cconv_tv_bf(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTInfo info = s->info;
  CTSize pos, bsz;
  uint32_t val;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  /* NYI: packed bitfields may cause misaligned reads. */
  switch (ctype_bitcsz(info)) {
  case 4: val = *(uint32_t *)sp; break;
  case 2: val = *(uint16_t *)sp; break;
  case 1: val = *(uint8_t *)sp; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    val = 0;
    break;
  }
  /* Check if a packed bitfield crosses a container boundary. */
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  if (!(info & CTF_BOOL)) {
    CTSize shift = 32 - bsz;
    if (!(info & CTF_UNSIGNED)) {
      setintV(o, (int32_t)(val << (shift-pos)) >> shift);
    } else {
      val = (val << (shift-pos)) >> shift;
      if (!LJ_DUALNUM || (int32_t)val < 0)
	setnumV(o, (lua_Number)(uint32_t)val);
      else
	setintV(o, (int32_t)val);
    }
  } else {
    uint32_t b = (val >> pos) & 1;
    lj_assertCTS(bsz == 1, "bad bool bitfield size");
    setboolV(o, b);
    setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
  }
  return 0;  /* No GC step needed. */
}